

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_SAX2(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  size_t sVar30;
  long lVar31;
  undefined4 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  bool bVar35;
  int n_notationName;
  ulong uVar36;
  char *pcVar37;
  undefined4 *puVar38;
  ulong uVar39;
  int n_defaultValue;
  uint uVar40;
  uint uVar41;
  ulong uVar42;
  undefined8 uVar43;
  undefined4 uVar44;
  undefined8 uVar45;
  xmlChar *pxVar46;
  undefined4 uVar47;
  int n_len;
  uint uVar48;
  int n_URI;
  int test_ret_14;
  int *piVar49;
  int n_value;
  undefined8 *puVar50;
  int test_ret_3;
  int test_ret_2;
  int test_ret_25;
  int test_ret;
  int test_ret_5;
  int test_ret_4;
  
  if (quiet == '\0') {
    puts("Testing SAX2 : 38 of 38 functions ...");
  }
  iVar3 = xmlMemBlocks();
  docbDefaultSAXHandlerInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar3 != iVar4) {
    iVar5 = xmlMemBlocks();
    printf("Leak of %d blocks found in docbDefaultSAXHandlerInit",(ulong)(uint)(iVar5 - iVar3));
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  htmlDefaultSAXHandlerInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar6 = xmlMemBlocks();
  if (iVar5 != iVar6) {
    iVar7 = xmlMemBlocks();
    printf("Leak of %d blocks found in htmlDefaultSAXHandlerInit",(ulong)(uint)(iVar7 - iVar5));
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  xmlDefaultSAXHandlerInit();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar8 = xmlMemBlocks();
  if (iVar7 != iVar8) {
    iVar9 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlDefaultSAXHandlerInit",(ulong)(uint)(iVar9 - iVar7));
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar9 = 0;
  _test_ret = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar12 = 0;
    do {
      uVar42 = 0;
      do {
        uVar39 = 0;
        do {
          uVar36 = 0;
          do {
            uVar40 = 0;
            puVar50 = &DAT_00165d70;
            do {
              iVar10 = xmlMemBlocks();
              if (uVar12 < 4) {
                uVar43 = (&DAT_00165d70)[uVar12];
              }
              else {
                uVar43 = 0;
              }
              if ((uint)uVar42 < 4) {
                uVar34 = (&DAT_00165d70)[uVar42];
              }
              else {
                uVar34 = 0;
              }
              uVar44 = 0xffffffff;
              uVar32 = 0xffffffff;
              if ((uint)uVar39 < 4) {
                uVar32 = (&DAT_0016343c)[uVar39];
              }
              if ((uint)uVar36 < 4) {
                uVar44 = (&DAT_0016343c)[uVar36];
              }
              if (uVar40 < 4) {
                uVar33 = *puVar50;
              }
              else {
                uVar33 = 0;
              }
              xmlSAX2AttributeDecl(0,uVar43,uVar34,uVar32,uVar44,uVar33,0);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar11 = xmlMemBlocks();
              if (iVar10 != iVar11) {
                iVar11 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlSAX2AttributeDecl",
                       (ulong)(uint)(iVar11 - iVar10));
                iVar9 = iVar9 + 1;
                printf(" %d",_test_ret);
                printf(" %d",(ulong)uVar12);
                printf(" %d",uVar42);
                printf(" %d",uVar39);
                printf(" %d",uVar36);
                printf(" %d");
                printf(" %d");
                putchar(10);
              }
              uVar40 = uVar40 + 1;
              puVar50 = puVar50 + 1;
            } while (uVar40 != 5);
            uVar40 = (uint)uVar36 + 1;
            uVar36 = (ulong)uVar40;
          } while (uVar40 != 4);
          uVar40 = (uint)uVar39 + 1;
          uVar39 = (ulong)uVar40;
        } while (uVar40 != 4);
        uVar40 = (uint)uVar42 + 1;
        uVar42 = (ulong)uVar40;
      } while (uVar40 != 5);
      uVar12 = uVar12 + 1;
    } while (uVar12 != 5);
    _test_ret = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  test_ret = 0;
  _test_ret_2 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar42 = 0;
    do {
      piVar49 = &DAT_0016343c;
      uVar39 = 0;
      do {
        iVar10 = xmlMemBlocks();
        switch(uVar42) {
        case 0:
          bVar2 = false;
          pcVar37 = "foo";
          break;
        case 1:
          bVar2 = false;
          pcVar37 = "<foo/>";
          break;
        case 2:
          bVar2 = false;
          pcVar37 = anon_var_dwarf_1b0;
          break;
        case 3:
          bVar2 = false;
          pcVar37 = " 2ab ";
          break;
        default:
          bVar2 = true;
          pcVar37 = (char *)0x0;
        }
        iVar11 = *piVar49;
        if ((bVar2) || (sVar30 = strlen(pcVar37), iVar11 <= (int)sVar30 + 1)) {
          xmlSAX2CDataBlock(0,pcVar37,iVar11);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar11 = xmlMemBlocks();
          if (iVar10 != iVar11) {
            iVar11 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2CDataBlock",(ulong)(uint)(iVar11 - iVar10));
            test_ret = test_ret + 1;
            printf(" %d",_test_ret_2);
            printf(" %d",uVar42);
            printf(" %d",uVar39);
            putchar(10);
          }
        }
        uVar12 = (int)uVar39 + 1;
        uVar39 = (ulong)uVar12;
        piVar49 = piVar49 + 1;
      } while (uVar12 != 4);
      uVar12 = (int)uVar42 + 1;
      uVar42 = (ulong)uVar12;
    } while (uVar12 != 5);
    _test_ret_2 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar3 = (uint)(iVar5 != iVar6) + (uint)(iVar3 != iVar4) + (uint)(iVar7 != iVar8) + iVar9 +
          test_ret;
  test_ret = 0;
  _test_ret_2 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar42 = 0;
    do {
      piVar49 = &DAT_0016343c;
      uVar39 = 0;
      do {
        iVar4 = xmlMemBlocks();
        switch(uVar42) {
        case 0:
          bVar2 = false;
          pcVar37 = "foo";
          break;
        case 1:
          bVar2 = false;
          pcVar37 = "<foo/>";
          break;
        case 2:
          bVar2 = false;
          pcVar37 = anon_var_dwarf_1b0;
          break;
        case 3:
          bVar2 = false;
          pcVar37 = " 2ab ";
          break;
        default:
          bVar2 = true;
          pcVar37 = (char *)0x0;
        }
        iVar5 = *piVar49;
        if ((bVar2) || (sVar30 = strlen(pcVar37), iVar5 <= (int)sVar30 + 1)) {
          xmlSAX2Characters(0,pcVar37,iVar5);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2Characters",(ulong)(uint)(iVar5 - iVar4));
            test_ret = test_ret + 1;
            printf(" %d",_test_ret_2);
            printf(" %d",uVar42);
            printf(" %d",uVar39);
            putchar(10);
          }
        }
        uVar12 = (int)uVar39 + 1;
        uVar39 = (ulong)uVar12;
        piVar49 = piVar49 + 1;
      } while (uVar12 != 4);
      uVar12 = (int)uVar42 + 1;
      uVar42 = (ulong)uVar12;
    } while (uVar12 != 5);
    _test_ret_2 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar12 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar40 = 0;
    puVar50 = &DAT_00165d70;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar40 < 4) {
        uVar43 = *puVar50;
      }
      else {
        uVar43 = 0;
      }
      xmlSAX2Comment(0,uVar43);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2Comment",(ulong)(uint)(iVar6 - iVar5));
        iVar4 = iVar4 + 1;
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
      }
      uVar40 = uVar40 + 1;
      puVar50 = puVar50 + 1;
    } while (uVar40 != 5);
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar12 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar42 = 0;
    do {
      puVar38 = &DAT_0016343c;
      uVar40 = 0;
      do {
        iVar6 = xmlMemBlocks();
        if ((uint)uVar42 < 4) {
          uVar43 = (&DAT_00165d70)[uVar42];
        }
        else {
          uVar43 = 0;
        }
        uVar32 = 0xffffffff;
        if (uVar40 < 4) {
          uVar32 = *puVar38;
        }
        xmlSAX2ElementDecl(0,uVar43,uVar32,0);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAX2ElementDecl",(ulong)(uint)(iVar7 - iVar6));
          iVar5 = iVar5 + 1;
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar42);
          printf(" %d");
          printf(" %d");
          putchar(10);
        }
        uVar40 = uVar40 + 1;
        puVar38 = puVar38 + 1;
      } while (uVar40 != 4);
      uVar40 = (uint)uVar42 + 1;
      uVar42 = (ulong)uVar40;
    } while (uVar40 != 5);
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  iVar3 = iVar3 + test_ret;
  function_tests = function_tests + 1;
  uVar12 = 0;
  iVar6 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    iVar7 = xmlMemBlocks();
    xmlSAX2EndDocument(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar7 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2EndDocument",(ulong)(uint)(iVar8 - iVar7));
      iVar6 = iVar6 + 1;
      printf(" %d",(ulong)uVar12);
      putchar(10);
    }
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar12 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar40 = 0;
    puVar50 = &DAT_00165d70;
    do {
      iVar8 = xmlMemBlocks();
      if (uVar40 < 4) {
        uVar43 = *puVar50;
      }
      else {
        uVar43 = 0;
      }
      xmlSAX2EndElement(0,uVar43);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2EndElement",(ulong)(uint)(iVar9 - iVar8));
        iVar7 = iVar7 + 1;
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
      }
      uVar40 = uVar40 + 1;
      puVar50 = puVar50 + 1;
    } while (uVar40 != 5);
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar8 = 0;
  _test_ret_3 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar42 = 0;
    do {
      uVar39 = 0;
      do {
        uVar12 = 0;
        puVar50 = &DAT_00165d70;
        do {
          iVar9 = xmlMemBlocks();
          if ((uint)uVar42 < 4) {
            uVar43 = (&DAT_00165d70)[uVar42];
          }
          else {
            uVar43 = 0;
          }
          if ((uint)uVar39 < 4) {
            uVar34 = (&DAT_00165d70)[uVar39];
          }
          else {
            uVar34 = 0;
          }
          if (uVar12 < 4) {
            uVar33 = *puVar50;
          }
          else {
            uVar33 = 0;
          }
          xmlSAX2EndElementNs(0,uVar43,uVar34,uVar33);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar10 = xmlMemBlocks();
          if (iVar9 != iVar10) {
            iVar10 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2EndElementNs",(ulong)(uint)(iVar10 - iVar9));
            iVar8 = iVar8 + 1;
            printf(" %d",_test_ret_3);
            printf(" %d",uVar42);
            printf(" %d",uVar39);
            printf(" %d");
            putchar(10);
          }
          uVar12 = uVar12 + 1;
          puVar50 = puVar50 + 1;
        } while (uVar12 != 5);
        uVar12 = (uint)uVar39 + 1;
        uVar39 = (ulong)uVar12;
      } while (uVar12 != 5);
      uVar12 = (uint)uVar42 + 1;
      uVar42 = (ulong)uVar12;
    } while (uVar12 != 5);
    _test_ret_3 = 1;
    bVar2 = false;
  } while (bVar35);
  iVar9 = 0;
  function_tests = function_tests + 1;
  _test_ret = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar12 = 0;
    do {
      uVar42 = 0;
      do {
        uVar39 = 0;
        do {
          uVar36 = 0;
          do {
            bVar2 = true;
            do {
              bVar1 = bVar2;
              iVar10 = xmlMemBlocks();
              if (uVar12 < 4) {
                uVar43 = (&DAT_00165d70)[uVar12];
              }
              else {
                uVar43 = 0;
              }
              uVar32 = 0xffffffff;
              if ((uint)uVar42 < 4) {
                uVar32 = (&DAT_0016343c)[uVar42];
              }
              if ((uint)uVar39 < 4) {
                uVar34 = (&DAT_00165d70)[uVar39];
              }
              else {
                uVar34 = 0;
              }
              if ((uint)uVar36 < 4) {
                uVar33 = (&DAT_00165d70)[uVar36];
              }
              else {
                uVar33 = 0;
              }
              pxVar46 = (xmlChar *)0x0;
              if (bVar1) {
                pxVar46 = chartab;
              }
              xmlSAX2EntityDecl(0,uVar43,uVar32,uVar34,uVar33,pxVar46);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar11 = xmlMemBlocks();
              if (iVar10 != iVar11) {
                iVar11 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlSAX2EntityDecl",(ulong)(uint)(iVar11 - iVar10)
                      );
                iVar9 = iVar9 + 1;
                printf(" %d",_test_ret);
                printf(" %d",(ulong)uVar12);
                printf(" %d",uVar42);
                printf(" %d",uVar39);
                printf(" %d",uVar36);
                printf(" %d");
                putchar(10);
              }
              bVar2 = false;
            } while (bVar1);
            uVar40 = (uint)uVar36 + 1;
            uVar36 = (ulong)uVar40;
          } while (uVar40 != 5);
          uVar40 = (uint)uVar39 + 1;
          uVar39 = (ulong)uVar40;
        } while (uVar40 != 5);
        uVar40 = (uint)uVar42 + 1;
        uVar42 = (ulong)uVar40;
      } while (uVar40 != 4);
      uVar12 = uVar12 + 1;
    } while (uVar12 != 5);
    _test_ret = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar10 = 0;
  _test_ret_3 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar12 = 0;
    do {
      uVar42 = 0;
      do {
        uVar40 = 0;
        puVar50 = &DAT_00165d70;
        do {
          iVar11 = xmlMemBlocks();
          if (uVar12 < 4) {
            uVar43 = (&DAT_00165d70)[uVar12];
          }
          else {
            uVar43 = 0;
          }
          if ((uint)uVar42 < 4) {
            uVar34 = (&DAT_00165d70)[uVar42];
          }
          else {
            uVar34 = 0;
          }
          if (uVar40 < 4) {
            uVar33 = *puVar50;
          }
          else {
            uVar33 = 0;
          }
          xmlSAX2ExternalSubset(0,uVar43,uVar34,uVar33);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar13 = xmlMemBlocks();
          if (iVar11 != iVar13) {
            iVar13 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2ExternalSubset",(ulong)(uint)(iVar13 - iVar11)
                  );
            iVar10 = iVar10 + 1;
            printf(" %d",_test_ret_3);
            printf(" %d",(ulong)uVar12);
            printf(" %d",uVar42);
            printf(" %d");
            putchar(10);
          }
          uVar40 = uVar40 + 1;
          puVar50 = puVar50 + 1;
        } while (uVar40 != 5);
        uVar40 = (uint)uVar42 + 1;
        uVar42 = (ulong)uVar40;
      } while (uVar40 != 5);
      uVar12 = uVar12 + 1;
    } while (uVar12 != 5);
    _test_ret_3 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  uVar12 = 0;
  iVar11 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    iVar13 = xmlMemBlocks();
    xmlSAX2GetColumnNumber(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2GetColumnNumber",(ulong)(uint)(iVar14 - iVar13));
      iVar11 = iVar11 + 1;
      printf(" %d",(ulong)uVar12);
      putchar(10);
    }
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar13 = 0;
  uVar12 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar40 = 0;
    puVar50 = &DAT_00165d70;
    do {
      iVar14 = xmlMemBlocks();
      if (uVar40 < 4) {
        uVar43 = *puVar50;
      }
      else {
        uVar43 = 0;
      }
      lVar31 = xmlSAX2GetEntity(0,uVar43);
      if (lVar31 != 0) {
        xmlUnlinkNode(lVar31);
        xmlFreeNode();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar15 = xmlMemBlocks();
      if (iVar14 != iVar15) {
        iVar15 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2GetEntity",(ulong)(uint)(iVar15 - iVar14));
        iVar13 = iVar13 + 1;
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
      }
      uVar40 = uVar40 + 1;
      puVar50 = puVar50 + 1;
    } while (uVar40 != 5);
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  uVar12 = 0;
  iVar14 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    iVar15 = xmlMemBlocks();
    xmlSAX2GetLineNumber(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2GetLineNumber",(ulong)(uint)(iVar16 - iVar15));
      iVar14 = iVar14 + 1;
      printf(" %d",(ulong)uVar12);
      putchar(10);
    }
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar15 = 0;
  uVar12 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar40 = 0;
    puVar50 = &DAT_00165d70;
    do {
      iVar16 = xmlMemBlocks();
      if (uVar40 < 4) {
        uVar43 = *puVar50;
      }
      else {
        uVar43 = 0;
      }
      lVar31 = xmlSAX2GetParameterEntity(0,uVar43);
      if (lVar31 != 0) {
        xmlUnlinkNode(lVar31);
        xmlFreeNode();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar17 = xmlMemBlocks();
      if (iVar16 != iVar17) {
        iVar17 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2GetParameterEntity",(ulong)(uint)(iVar17 - iVar16)
              );
        iVar15 = iVar15 + 1;
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
      }
      uVar40 = uVar40 + 1;
      puVar50 = puVar50 + 1;
    } while (uVar40 != 5);
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  uVar12 = 0;
  iVar16 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    iVar17 = xmlMemBlocks();
    xmlSAX2GetPublicId(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2GetPublicId",(ulong)(uint)(iVar18 - iVar17));
      iVar16 = iVar16 + 1;
      printf(" %d",(ulong)uVar12);
      putchar(10);
    }
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  uVar12 = 0;
  iVar17 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    iVar18 = xmlMemBlocks();
    xmlSAX2GetSystemId(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2GetSystemId",(ulong)(uint)(iVar19 - iVar18));
      iVar17 = iVar17 + 1;
      printf(" %d",(ulong)uVar12);
      putchar(10);
    }
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  uVar12 = 0;
  iVar18 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    iVar19 = xmlMemBlocks();
    xmlSAX2HasExternalSubset(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2HasExternalSubset",(ulong)(uint)(iVar20 - iVar19));
      iVar18 = iVar18 + 1;
      printf(" %d",(ulong)uVar12);
      putchar(10);
    }
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  uVar12 = 0;
  iVar19 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    iVar20 = xmlMemBlocks();
    xmlSAX2HasInternalSubset(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar21 = xmlMemBlocks();
    if (iVar20 != iVar21) {
      iVar21 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2HasInternalSubset",(ulong)(uint)(iVar21 - iVar20));
      iVar19 = iVar19 + 1;
      printf(" %d",(ulong)uVar12);
      putchar(10);
    }
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar20 = 0;
  _test_ret_2 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar42 = 0;
    do {
      piVar49 = &DAT_0016343c;
      uVar12 = 0;
      do {
        iVar21 = xmlMemBlocks();
        switch(uVar42) {
        case 0:
          bVar2 = false;
          pcVar37 = "foo";
          break;
        case 1:
          bVar2 = false;
          pcVar37 = "<foo/>";
          break;
        case 2:
          bVar2 = false;
          pcVar37 = anon_var_dwarf_1b0;
          break;
        case 3:
          bVar2 = false;
          pcVar37 = " 2ab ";
          break;
        default:
          bVar2 = true;
          pcVar37 = (char *)0x0;
        }
        iVar22 = *piVar49;
        if ((bVar2) || (sVar30 = strlen(pcVar37), iVar22 <= (int)sVar30 + 1)) {
          xmlSAX2IgnorableWhitespace(0,pcVar37,iVar22);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar22 = xmlMemBlocks();
          if (iVar21 != iVar22) {
            iVar22 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2IgnorableWhitespace",
                   (ulong)(uint)(iVar22 - iVar21));
            iVar20 = iVar20 + 1;
            printf(" %d",_test_ret_2);
            printf(" %d",uVar42);
            printf(" %d",(ulong)uVar12);
            putchar(10);
          }
        }
        uVar12 = uVar12 + 1;
        piVar49 = piVar49 + 1;
      } while (uVar12 != 4);
      uVar12 = (int)uVar42 + 1;
      uVar42 = (ulong)uVar12;
    } while (uVar12 != 5);
    _test_ret_2 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  puVar38 = &DAT_0016343c;
  uVar12 = 0;
  iVar21 = 0;
  do {
    iVar22 = xmlMemBlocks();
    xmlSAX2InitDefaultSAXHandler(0,*puVar38);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar23 = xmlMemBlocks();
    if (iVar22 != iVar23) {
      iVar23 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2InitDefaultSAXHandler",
             (ulong)(uint)(iVar23 - iVar22));
      iVar21 = iVar21 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar12);
      putchar(10);
    }
    uVar12 = uVar12 + 1;
    puVar38 = puVar38 + 1;
  } while (uVar12 != 4);
  function_tests = function_tests + 1;
  iVar22 = xmlMemBlocks();
  xmlSAX2InitDocbDefaultSAXHandler(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar23 = xmlMemBlocks();
  if (iVar22 != iVar23) {
    iVar24 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSAX2InitDocbDefaultSAXHandler",
           (ulong)(uint)(iVar24 - iVar22));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar24 = xmlMemBlocks();
  xmlSAX2InitHtmlDefaultSAXHandler(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar25 = xmlMemBlocks();
  if (iVar24 != iVar25) {
    iVar26 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSAX2InitHtmlDefaultSAXHandler",
           (ulong)(uint)(iVar26 - iVar24));
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar26 = 0;
  _test_ret_3 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar42 = 0;
    do {
      uVar12 = 0;
      do {
        puVar50 = &DAT_00165d70;
        uVar40 = 0;
        do {
          iVar27 = xmlMemBlocks();
          if ((uint)uVar42 < 4) {
            uVar43 = (&DAT_00165d70)[uVar42];
          }
          else {
            uVar43 = 0;
          }
          if (uVar12 < 4) {
            uVar34 = (&DAT_00165d70)[uVar12];
          }
          else {
            uVar34 = 0;
          }
          if (uVar40 < 4) {
            uVar33 = *puVar50;
          }
          else {
            uVar33 = 0;
          }
          xmlSAX2InternalSubset(0,uVar43,uVar34,uVar33);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar28 = xmlMemBlocks();
          if (iVar27 != iVar28) {
            iVar28 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2InternalSubset",(ulong)(uint)(iVar28 - iVar27)
                  );
            iVar26 = iVar26 + 1;
            printf(" %d",_test_ret_3);
            printf(" %d",uVar42);
            printf(" %d",(ulong)uVar12);
            printf(" %d");
            putchar(10);
          }
          uVar40 = uVar40 + 1;
          puVar50 = puVar50 + 1;
        } while (uVar40 != 5);
        uVar12 = uVar12 + 1;
      } while (uVar12 != 5);
      uVar12 = (uint)uVar42 + 1;
      uVar42 = (ulong)uVar12;
    } while (uVar12 != 5);
    _test_ret_3 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  uVar12 = 0;
  iVar27 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    iVar28 = xmlMemBlocks();
    xmlSAX2IsStandalone(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar29 = xmlMemBlocks();
    if (iVar28 != iVar29) {
      iVar29 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2IsStandalone",(ulong)(uint)(iVar29 - iVar28));
      iVar27 = iVar27 + 1;
      printf(" %d",(ulong)uVar12);
      putchar(10);
    }
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  test_ret_5 = (int)(iVar24 != iVar25);
  iVar4 = iVar18 + iVar19 +
          iVar3 + iVar4 + iVar5 + iVar6 + iVar7 + iVar8 + iVar9 + iVar10 + iVar11 + iVar13 + iVar14
          + iVar15 + iVar16 + iVar17 + iVar20 + iVar21 + (uint)(iVar22 != iVar23) + test_ret_5;
  iVar3 = 0;
  _test_ret_3 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar42 = 0;
    do {
      uVar12 = 0;
      do {
        uVar40 = 0;
        puVar50 = &DAT_00165d70;
        do {
          iVar5 = xmlMemBlocks();
          if ((uint)uVar42 < 4) {
            uVar43 = (&DAT_00165d70)[uVar42];
          }
          else {
            uVar43 = 0;
          }
          if (uVar12 < 4) {
            uVar34 = (&DAT_00165d70)[uVar12];
          }
          else {
            uVar34 = 0;
          }
          if (uVar40 < 4) {
            uVar33 = *puVar50;
          }
          else {
            uVar33 = 0;
          }
          xmlSAX2NotationDecl(0,uVar43,uVar34,uVar33);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar6 = xmlMemBlocks();
          if (iVar5 != iVar6) {
            iVar6 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2NotationDecl",(ulong)(uint)(iVar6 - iVar5));
            iVar3 = iVar3 + 1;
            printf(" %d",_test_ret_3);
            printf(" %d",uVar42);
            printf(" %d",(ulong)uVar12);
            printf(" %d");
            putchar(10);
          }
          uVar40 = uVar40 + 1;
          puVar50 = puVar50 + 1;
        } while (uVar40 != 5);
        uVar12 = uVar12 + 1;
      } while (uVar12 != 5);
      uVar12 = (uint)uVar42 + 1;
      uVar42 = (ulong)uVar12;
    } while (uVar12 != 5);
    _test_ret_3 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar12 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar42 = 0;
    do {
      puVar50 = &DAT_00165d70;
      uVar40 = 0;
      do {
        iVar6 = xmlMemBlocks();
        if ((uint)uVar42 < 4) {
          uVar43 = (&DAT_00165d70)[uVar42];
        }
        else {
          uVar43 = 0;
        }
        if (uVar40 < 4) {
          uVar34 = *puVar50;
        }
        else {
          uVar34 = 0;
        }
        xmlSAX2ProcessingInstruction(0,uVar43,uVar34);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAX2ProcessingInstruction",
                 (ulong)(uint)(iVar7 - iVar6));
          iVar5 = iVar5 + 1;
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar42);
          printf(" %d");
          putchar(10);
        }
        uVar40 = uVar40 + 1;
        puVar50 = puVar50 + 1;
      } while (uVar40 != 5);
      uVar40 = (uint)uVar42 + 1;
      uVar42 = (ulong)uVar40;
    } while (uVar40 != 5);
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar12 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar40 = 0;
    puVar50 = &DAT_00165d70;
    do {
      iVar7 = xmlMemBlocks();
      if (uVar40 < 4) {
        uVar43 = *puVar50;
      }
      else {
        uVar43 = 0;
      }
      xmlSAX2Reference(0,uVar43);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2Reference",(ulong)(uint)(iVar8 - iVar7));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        putchar(10);
      }
      uVar40 = uVar40 + 1;
      puVar50 = puVar50 + 1;
    } while (uVar40 != 5);
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar12 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar42 = 0;
    do {
      puVar50 = &DAT_00165d70;
      uVar40 = 0;
      do {
        iVar8 = xmlMemBlocks();
        if ((uint)uVar42 < 4) {
          uVar43 = (&DAT_00165d70)[uVar42];
        }
        else {
          uVar43 = 0;
        }
        if (uVar40 < 4) {
          uVar34 = *puVar50;
        }
        else {
          uVar34 = 0;
        }
        xmlSAX2ResolveEntity(0,uVar43,uVar34);
        xmlFreeInputStream();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar9 = xmlMemBlocks();
        if (iVar8 != iVar9) {
          iVar9 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAX2ResolveEntity",(ulong)(uint)(iVar9 - iVar8));
          iVar7 = iVar7 + 1;
          printf(" %d",(ulong)uVar12);
          printf(" %d",uVar42);
          printf(" %d");
          putchar(10);
        }
        uVar40 = uVar40 + 1;
        puVar50 = puVar50 + 1;
      } while (uVar40 != 5);
      uVar40 = (uint)uVar42 + 1;
      uVar42 = (ulong)uVar40;
    } while (uVar40 != 5);
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar8 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    iVar9 = xmlMemBlocks();
    xmlSAX2SetDocumentLocator(0,0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2SetDocumentLocator",(ulong)(uint)(iVar10 - iVar9));
      iVar8 = iVar8 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  uVar12 = 0;
  test_ret_25 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    iVar9 = xmlMemBlocks();
    xmlSAX2StartDocument(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAX2StartDocument",(ulong)(uint)(iVar10 - iVar9));
      test_ret_25 = test_ret_25 + 1;
      printf(" %d",(ulong)uVar12);
      putchar(10);
    }
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar12 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar40 = 0;
    puVar50 = &DAT_00165d70;
    do {
      iVar10 = xmlMemBlocks();
      if (uVar40 < 4) {
        uVar43 = *puVar50;
      }
      else {
        uVar43 = 0;
      }
      xmlSAX2StartElement(0,uVar43,0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAX2StartElement",(ulong)(uint)(iVar11 - iVar10));
        iVar9 = iVar9 + 1;
        printf(" %d",(ulong)uVar12);
        printf(" %d");
        printf(" %d");
        putchar(10);
      }
      uVar40 = uVar40 + 1;
      puVar50 = puVar50 + 1;
    } while (uVar40 != 5);
    uVar12 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar10 = 0;
  _test_ret_5 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar12 = 0;
    do {
      uVar40 = 0;
      do {
        uVar42 = 0;
        do {
          uVar39 = 0;
          do {
            uVar41 = 0;
            do {
              puVar38 = &DAT_0016343c;
              uVar48 = 0;
              do {
                iVar11 = xmlMemBlocks();
                if (uVar12 < 4) {
                  uVar43 = (&DAT_00165d70)[uVar12];
                }
                else {
                  uVar43 = 0;
                }
                if (uVar40 < 4) {
                  uVar34 = (&DAT_00165d70)[uVar40];
                }
                else {
                  uVar34 = 0;
                }
                if ((uint)uVar42 < 4) {
                  uVar33 = (&DAT_00165d70)[uVar42];
                }
                else {
                  uVar33 = 0;
                }
                uVar44 = 0xffffffff;
                uVar32 = 0xffffffff;
                if ((uint)uVar39 < 4) {
                  uVar32 = (&DAT_0016343c)[uVar39];
                }
                if (uVar41 < 4) {
                  uVar44 = (&DAT_0016343c)[uVar41];
                }
                uVar47 = 0xffffffff;
                if (uVar48 < 4) {
                  uVar47 = *puVar38;
                }
                xmlSAX2StartElementNs(0,uVar43,uVar34,uVar33,uVar32,0,uVar44,uVar47,0);
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar13 = xmlMemBlocks();
                if (iVar11 != iVar13) {
                  iVar13 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlSAX2StartElementNs",
                         (ulong)(uint)(iVar13 - iVar11));
                  iVar10 = iVar10 + 1;
                  printf(" %d",_test_ret_5);
                  printf(" %d",(ulong)uVar12);
                  printf(" %d",(ulong)uVar40);
                  printf(" %d",uVar42);
                  printf(" %d",uVar39);
                  printf(" %d",0);
                  printf(" %d",(ulong)uVar41);
                  printf(" %d");
                  printf(" %d");
                  putchar(10);
                }
                uVar48 = uVar48 + 1;
                puVar38 = puVar38 + 1;
              } while (uVar48 != 4);
              uVar41 = uVar41 + 1;
            } while (uVar41 != 4);
            uVar41 = (uint)uVar39 + 1;
            uVar39 = (ulong)uVar41;
          } while (uVar41 != 4);
          uVar41 = (uint)uVar42 + 1;
          uVar42 = (ulong)uVar41;
        } while (uVar41 != 5);
        uVar40 = uVar40 + 1;
      } while (uVar40 != 5);
      uVar12 = uVar12 + 1;
    } while (uVar12 != 5);
    _test_ret_5 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  iVar11 = 0;
  _test_ret_3 = 0;
  bVar2 = true;
  do {
    bVar35 = bVar2;
    uVar42 = 0;
    do {
      uVar39 = 0;
      do {
        uVar36 = 0;
        do {
          puVar50 = &DAT_00165d70;
          uVar12 = 0;
          do {
            iVar13 = xmlMemBlocks();
            if ((uint)uVar42 < 4) {
              uVar43 = (&DAT_00165d70)[uVar42];
            }
            else {
              uVar43 = 0;
            }
            if ((uint)uVar39 < 4) {
              uVar34 = (&DAT_00165d70)[uVar39];
            }
            else {
              uVar34 = 0;
            }
            if ((uint)uVar36 < 4) {
              uVar33 = (&DAT_00165d70)[uVar36];
            }
            else {
              uVar33 = 0;
            }
            if (uVar12 < 4) {
              uVar45 = *puVar50;
            }
            else {
              uVar45 = 0;
            }
            xmlSAX2UnparsedEntityDecl(0,uVar43,uVar34,uVar33,uVar45);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar14 = xmlMemBlocks();
            if (iVar13 != iVar14) {
              iVar14 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlSAX2UnparsedEntityDecl",
                     (ulong)(uint)(iVar14 - iVar13));
              iVar11 = iVar11 + 1;
              printf(" %d",_test_ret_3);
              printf(" %d",uVar42);
              printf(" %d",uVar39);
              printf(" %d",uVar36);
              printf(" %d");
              putchar(10);
            }
            uVar12 = uVar12 + 1;
            puVar50 = puVar50 + 1;
          } while (uVar12 != 5);
          uVar12 = (uint)uVar36 + 1;
          uVar36 = (ulong)uVar12;
        } while (uVar12 != 5);
        uVar12 = (uint)uVar39 + 1;
        uVar39 = (ulong)uVar12;
      } while (uVar12 != 5);
      uVar12 = (uint)uVar42 + 1;
      uVar42 = (ulong)uVar12;
    } while (uVar12 != 5);
    _test_ret_3 = 1;
    bVar2 = false;
  } while (bVar35);
  function_tests = function_tests + 1;
  puVar38 = &DAT_0016343c;
  uVar42 = 0;
  iVar13 = 0;
  do {
    iVar14 = xmlMemBlocks();
    xmlSAXDefaultVersion(*puVar38);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAXDefaultVersion",(ulong)(uint)(iVar15 - iVar14));
      iVar13 = iVar13 + 1;
      printf(" %d",uVar42);
      putchar(10);
    }
    uVar12 = (int)uVar42 + 1;
    uVar42 = (ulong)uVar12;
    puVar38 = puVar38 + 1;
  } while (uVar12 != 4);
  function_tests = function_tests + 1;
  puVar38 = &DAT_0016343c;
  uVar12 = 0;
  iVar14 = 0;
  do {
    iVar15 = xmlMemBlocks();
    xmlSAXVersion(0,*puVar38);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSAXVersion",(ulong)(uint)(iVar16 - iVar15));
      iVar14 = iVar14 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar12);
      putchar(10);
    }
    uVar12 = uVar12 + 1;
    puVar38 = puVar38 + 1;
  } while (uVar12 != 4);
  function_tests = function_tests + 1;
  uVar12 = iVar10 + iVar11 +
           iVar4 + iVar26 + iVar27 + iVar3 + iVar5 + iVar6 + iVar7 + iVar8 + test_ret_25 + iVar9 +
           iVar13 + iVar14;
  if (uVar12 != 0) {
    printf("Module SAX2: %d errors\n",(ulong)uVar12);
  }
  return uVar12;
}

Assistant:

static int
test_SAX2(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing SAX2 : 38 of 38 functions ...\n");
    test_ret += test_docbDefaultSAXHandlerInit();
    test_ret += test_htmlDefaultSAXHandlerInit();
    test_ret += test_xmlDefaultSAXHandlerInit();
    test_ret += test_xmlSAX2AttributeDecl();
    test_ret += test_xmlSAX2CDataBlock();
    test_ret += test_xmlSAX2Characters();
    test_ret += test_xmlSAX2Comment();
    test_ret += test_xmlSAX2ElementDecl();
    test_ret += test_xmlSAX2EndDocument();
    test_ret += test_xmlSAX2EndElement();
    test_ret += test_xmlSAX2EndElementNs();
    test_ret += test_xmlSAX2EntityDecl();
    test_ret += test_xmlSAX2ExternalSubset();
    test_ret += test_xmlSAX2GetColumnNumber();
    test_ret += test_xmlSAX2GetEntity();
    test_ret += test_xmlSAX2GetLineNumber();
    test_ret += test_xmlSAX2GetParameterEntity();
    test_ret += test_xmlSAX2GetPublicId();
    test_ret += test_xmlSAX2GetSystemId();
    test_ret += test_xmlSAX2HasExternalSubset();
    test_ret += test_xmlSAX2HasInternalSubset();
    test_ret += test_xmlSAX2IgnorableWhitespace();
    test_ret += test_xmlSAX2InitDefaultSAXHandler();
    test_ret += test_xmlSAX2InitDocbDefaultSAXHandler();
    test_ret += test_xmlSAX2InitHtmlDefaultSAXHandler();
    test_ret += test_xmlSAX2InternalSubset();
    test_ret += test_xmlSAX2IsStandalone();
    test_ret += test_xmlSAX2NotationDecl();
    test_ret += test_xmlSAX2ProcessingInstruction();
    test_ret += test_xmlSAX2Reference();
    test_ret += test_xmlSAX2ResolveEntity();
    test_ret += test_xmlSAX2SetDocumentLocator();
    test_ret += test_xmlSAX2StartDocument();
    test_ret += test_xmlSAX2StartElement();
    test_ret += test_xmlSAX2StartElementNs();
    test_ret += test_xmlSAX2UnparsedEntityDecl();
    test_ret += test_xmlSAXDefaultVersion();
    test_ret += test_xmlSAXVersion();

    if (test_ret != 0)
	printf("Module SAX2: %d errors\n", test_ret);
    return(test_ret);
}